

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObject::EnsureObjectIsShared(CSharedMemoryObject *this,CPalThread *pthr)

{
  DWORD DVar1;
  SHMObjData *local_38;
  SHMObjData *psmod;
  SHMPTR shmObjData;
  IDataLock *pDataLock;
  CPalThread *pCStack_18;
  PAL_ERROR palError;
  CPalThread *pthr_local;
  CSharedMemoryObject *this_local;
  
  pDataLock._4_4_ = 0;
  shmObjData = 0;
  pCStack_18 = pthr;
  pthr_local = (CPalThread *)this;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","EnsureObjectIsShared",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x21f);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  SHMLock();
  if (this->m_ObjectDomain != SharedObject) {
    DVar1 = CObjectType::GetSharedDataSize((this->super_CPalObjectBase).m_pot);
    if (DVar1 != 0) {
      CSimpleDataLock::AcquireLock(&this->m_sdlSharedData,pCStack_18,(IDataLock **)&shmObjData);
    }
    pDataLock._4_4_ = AllocateSharedDataItems(this,(SHMPTR *)&psmod,&local_38);
    if (pDataLock._4_4_ == 0) {
      PromoteSharedData(this,(SHMPTR)psmod,local_38);
      this->m_ObjectDomain = SharedObject;
    }
  }
  if (shmObjData != 0) {
    (*(code *)**(undefined8 **)shmObjData)(shmObjData,pCStack_18,1);
  }
  SHMRelease();
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pDataLock._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObject::EnsureObjectIsShared(
    CPalThread *pthr
    )
{
    PAL_ERROR palError = NO_ERROR;
    IDataLock *pDataLock = NULL;
    SHMPTR shmObjData;
    SHMObjData *psmod;

    _ASSERTE(NULL != pthr);

    ENTRY("CSharedMemoryObject::EnsureObjectIsShared"
        "(this = %p, pthr = %p)\n",
        this,
        pthr
        );

    //
    // Grab the shared memory lock and check if the object is already
    // shared
    //
    
    SHMLock();

    if (SharedObject == m_ObjectDomain)
    {
        goto EnsureObjectIsSharedExit;
    }

    //
    // Grab the local shared data lock, if necessary
    //
    
    if (0 != m_pot->GetSharedDataSize())
    {
        m_sdlSharedData.AcquireLock(pthr, &pDataLock);
    }

    //
    // Allocate the necessary shared data areas
    //

    palError = AllocateSharedDataItems(&shmObjData, &psmod);
    if (NO_ERROR != palError)
    {
        goto EnsureObjectIsSharedExit;
    }

    //
    // Promote the object's data and set the domain to shared
    //

    PromoteSharedData(shmObjData, psmod);
    m_ObjectDomain = SharedObject;

EnsureObjectIsSharedExit:

    if (NULL != pDataLock)
    {
        pDataLock->ReleaseLock(pthr, TRUE);
    }

    SHMRelease();

    LOGEXIT("CSharedMemoryObject::EnsureObjectIsShared returns %d\n", palError);

    return palError;    
}